

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteswap.h
# Opt level: O0

uint64_t internal_bswap_64(uint64_t x)

{
  ulong in_RDI;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return in_RDI >> 0x38 | (in_RDI & 0xff000000000000) >> 0x28 | (in_RDI & 0xff0000000000) >> 0x18
           | (in_RDI & 0xff00000000) >> 8 | (in_RDI & 0xff000000) << 8 | (in_RDI & 0xff0000) << 0x18
           | (in_RDI & 0xff00) << 0x28 | in_RDI << 0x38;
  }
  __stack_chk_fail();
}

Assistant:

inline BSWAP_CONSTEXPR uint64_t internal_bswap_64(uint64_t x)
{
#ifdef bitcoin_builtin_bswap64
    return bitcoin_builtin_bswap64(x);
#else
     return (((x & 0xff00000000000000ull) >> 56)
          | ((x & 0x00ff000000000000ull) >> 40)
          | ((x & 0x0000ff0000000000ull) >> 24)
          | ((x & 0x000000ff00000000ull) >> 8)
          | ((x & 0x00000000ff000000ull) << 8)
          | ((x & 0x0000000000ff0000ull) << 24)
          | ((x & 0x000000000000ff00ull) << 40)
          | ((x & 0x00000000000000ffull) << 56));
#endif
}